

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.h
# Opt level: O2

filemgr_config * __thiscall filemgr_config::operator=(filemgr_config *this,filemgr_config *config)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint16_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  
  iVar4 = config->ncacheblock;
  this->blocksize = config->blocksize;
  this->ncacheblock = iVar4;
  this->flag = config->flag;
  this->seqtree_opt = config->seqtree_opt;
  this->chunksize = config->chunksize;
  this->options = config->options;
  this->prefetch_duration = config->prefetch_duration;
  uVar5 = config->num_bcache_shards;
  this->num_wal_shards = config->num_wal_shards;
  this->num_bcache_shards = uVar5;
  uVar6 = (config->encryption_key).bytes[0];
  uVar7 = (config->encryption_key).bytes[1];
  uVar8 = (config->encryption_key).bytes[2];
  uVar9 = (config->encryption_key).bytes[3];
  uVar1 = *(undefined8 *)((config->encryption_key).bytes + 4);
  uVar2 = *(undefined8 *)((config->encryption_key).bytes + 0xc);
  uVar3 = *(undefined8 *)((config->encryption_key).bytes + 0x14);
  (this->encryption_key).algorithm = (config->encryption_key).algorithm;
  (this->encryption_key).bytes[0] = uVar6;
  (this->encryption_key).bytes[1] = uVar7;
  (this->encryption_key).bytes[2] = uVar8;
  (this->encryption_key).bytes[3] = uVar9;
  *(undefined8 *)((this->encryption_key).bytes + 4) = uVar1;
  *(undefined8 *)((this->encryption_key).bytes + 0xc) = uVar2;
  *(undefined8 *)((this->encryption_key).bytes + 0x14) = uVar3;
  *(undefined4 *)((this->encryption_key).bytes + 0x1c) =
       *(undefined4 *)((config->encryption_key).bytes + 0x1c);
  (this->block_reusing_threshold).super___atomic_base<unsigned_long>._M_i =
       (config->block_reusing_threshold).super___atomic_base<unsigned_long>._M_i;
  (this->num_keeping_headers).super___atomic_base<unsigned_long>._M_i =
       (config->num_keeping_headers).super___atomic_base<unsigned_long>._M_i;
  this->do_not_cache_doc_blocks = config->do_not_cache_doc_blocks;
  this->num_blocks_readahead = config->num_blocks_readahead;
  return this;
}

Assistant:

filemgr_config& operator=(const filemgr_config& config) {
        blocksize = config.blocksize;
        ncacheblock = config.ncacheblock;
        flag = config.flag;
        seqtree_opt = config.seqtree_opt;
        chunksize = config.chunksize;
        options = config.options;
        prefetch_duration = config.prefetch_duration;
        num_wal_shards = config.num_wal_shards;
        num_bcache_shards = config.num_bcache_shards;
        encryption_key = config.encryption_key;
        atomic_store_uint64_t(&block_reusing_threshold,
                              atomic_get_uint64_t(&config.block_reusing_threshold,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_keeping_headers,
                              atomic_get_uint64_t(&config.num_keeping_headers,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        do_not_cache_doc_blocks = config.do_not_cache_doc_blocks;
        num_blocks_readahead = config.num_blocks_readahead;
        return *this;
    }